

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O1

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::build
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  PrimInfoT<embree::BBox<embree::Vec3fa>_> *__new_size;
  Scene *pSVar5;
  GTypeMask GVar6;
  BVHN<4> *this_00;
  BuildRef *pBVar7;
  PrimRef *ptr;
  MemoryMonitorInterface *pMVar8;
  pointer ppTVar9;
  int iVar10;
  double dVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  size_t sVar16;
  ulong uVar17;
  char cVar18;
  long *plVar19;
  PrimRef *pPVar20;
  BuildRef *pBVar21;
  long lVar22;
  runtime_error *prVar23;
  uint uVar24;
  ulong uVar25;
  anon_union_8_2_d71db6ad_for_task_group_context_11 *paVar26;
  ulong uVar27;
  task_group_context *bounds;
  NodeRefPtr<4> root;
  size_t sVar28;
  BVH *pBVar29;
  PrimInfoT<embree::BBox<embree::Vec3fa>_> *pPVar30;
  pointer ppTVar31;
  ulong uVar32;
  size_t sVar33;
  anon_class_1_0_00000001 local_229;
  task_group_context context;
  string __str;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  size_t local_f8;
  size_t sStack_f0;
  blocked_range<unsigned_long> local_e8;
  anon_class_8_1_8991fb9c local_d0;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_twolevel_cpp:146:16)>
  body;
  anon_class_16_2_ed117de8_conflict33 local_58;
  anon_class_24_3_8ee612a4_conflict4 local_48;
  
  __new_size = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(this->scene->geometries).size_active;
  pPVar30 = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)
            ((long)(this->bvh->objects).
                   super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(this->bvh->objects).
                   super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  if (__new_size < pPVar30) {
    context.my_version = proxy_support;
    context.my_traits = (context_traits)0x4;
    context.my_node.my_prev_node = (intrusive_list_node *)0x0;
    context.my_node.my_next_node = (intrusive_list_node *)0x0;
    context.my_name = CUSTOM_CTX;
    local_138._0_8_ = this;
    tbb::detail::r1::initialize(&context);
    body.my_reduction = (anon_class_1_0_00000001 *)0x1;
    __str._M_dataplus._M_p = (pointer)&local_138;
    body.my_identity_element = pPVar30;
    body.my_real_body = (anon_class_16_2_ed117de8_conflict33 *)__new_size;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&body,(anon_class_8_1_898bcfc2 *)&__str,
          (auto_partitioner *)&local_e8,&context);
    cVar18 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar18 != '\0') {
      prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar23,"task cancelled");
      __cxa_throw(prVar23,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&context);
  }
  FastAllocator::reset(&this->bvh->alloc);
  pSVar5 = this->scene;
  GVar6 = this->gtype;
  uVar24 = (uint)GVar6;
  if ((uVar24 >> 0x14 & 1) == 0) {
    sVar33 = 0;
  }
  else {
    sVar33 = (pSVar5->world).numTriangles;
  }
  if ((uVar24 >> 0x15 & 1) != 0) {
    sVar33 = sVar33 + (pSVar5->world).numQuads;
  }
  if ((GVar6 & MTY_CURVE2) != ~MTY_ALL) {
    sVar33 = sVar33 + (pSVar5->world).numLineSegments;
  }
  if ((GVar6 & MTY_CURVE4) != ~MTY_ALL) {
    sVar33 = sVar33 + (pSVar5->world).numBezierCurves;
  }
  if ((GVar6 & MTY_POINTS) != ~MTY_ALL) {
    sVar33 = sVar33 + (pSVar5->world).numPoints;
  }
  if ((uVar24 >> 0x17 & 1) != 0) {
    sVar33 = sVar33 + (pSVar5->world).numSubdivPatches;
  }
  if ((uVar24 >> 0x1d & 1) != 0) {
    sVar33 = sVar33 + (pSVar5->world).numUserGeometries;
  }
  if ((uVar24 >> 0x1e & 1) != 0) {
    sVar33 = sVar33 + (pSVar5->world).numInstancesCheap;
  }
  if ((int)uVar24 < 0) {
    sVar33 = sVar33 + (pSVar5->world).numInstancesExpensive;
  }
  if ((uVar24 >> 0x18 & 1) != 0) {
    sVar33 = sVar33 + (pSVar5->world).numInstanceArrays;
  }
  if ((uVar24 >> 0x16 & 1) != 0) {
    sVar33 = sVar33 + (pSVar5->world).numGrids;
  }
  if (sVar33 == 0) {
    sVar33 = (this->prims).size_alloced;
    if ((this->prims).size_active != 0) {
      (this->prims).size_active = 0;
    }
    if ((this->prims).size_alloced == sVar33) {
      (this->prims).size_active = 0;
    }
    else {
      ptr = (this->prims).items;
      if (sVar33 != 0) {
        pMVar8 = (this->prims).alloc.device;
        (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar33 << 5,0);
      }
      sVar28 = sVar33 << 5;
      if (sVar28 < 0x1c00000) {
        pPVar20 = (PrimRef *)alignedMalloc(sVar28,0x20);
      }
      else {
        pPVar20 = (PrimRef *)os_malloc(sVar28,&(this->prims).alloc.hugepages);
      }
      (this->prims).items = pPVar20;
      if ((this->prims).size_active != 0) {
        lVar22 = 0x10;
        uVar25 = 0;
        do {
          pPVar20 = (this->prims).items;
          puVar1 = (undefined8 *)((long)ptr + lVar22 + -0x10);
          uVar15 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar20 + lVar22 + -0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar15;
          puVar1 = (undefined8 *)((long)&(ptr->lower).field_0 + lVar22);
          uVar15 = puVar1[1];
          puVar2 = (undefined8 *)((long)&(pPVar20->lower).field_0 + lVar22);
          *puVar2 = *puVar1;
          puVar2[1] = uVar15;
          uVar25 = uVar25 + 1;
          lVar22 = lVar22 + 0x20;
        } while (uVar25 < (this->prims).size_active);
      }
      sVar28 = (this->prims).size_alloced;
      if (ptr != (PrimRef *)0x0) {
        if (sVar28 << 5 < 0x1c00000) {
          alignedFree(ptr);
        }
        else {
          os_free(ptr,sVar28 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar28 != 0) {
        pMVar8 = (this->prims).alloc.device;
        (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar28 * -0x20,1);
      }
      (this->prims).size_active = 0;
      (this->prims).size_alloced = sVar33;
    }
    context.my_cpu_ctl_env = 0x7f8000007f800000;
    context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)0x7f800000;
    context.my_version = gold_2021U1;
    context.my_traits = (context_traits)0x0;
    context.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x80;
    context.my_lifetime_state._M_i = 0x7f;
    context.field_6.my_parent = (task_group_context *)0xff800000ff800000;
    context.my_context_list = (context_list *)0xff800000ff800000;
    context.my_node.my_prev_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_node.my_next_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_exception._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
    context.my_itt_caller = (void *)0xff800000ff800000;
    BVHN<4>::set(this->bvh,(NodeRef)0x8,(LBBox3fa *)&context,0);
  }
  else {
    dVar11 = (double)(sVar33 + 3 >> 2) * 1.2 * 176.0;
    uVar25 = (ulong)dVar11;
    FastAllocator::init_estimate
              (&this->bvh->alloc,
               ((long)(dVar11 - 9.223372036854776e+18) & (long)uVar25 >> 0x3f | uVar25) +
               (sVar33 + 3 & 0x3fffffffffffffc) * 0x10);
    this_00 = this->bvh;
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct((ulong)&__str,'\x01');
    *__str._M_dataplus._M_p = '4';
    plVar19 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x1ffdf3e);
    pPVar30 = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(plVar19 + 2);
    if ((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)*plVar19 == pPVar30) {
      body.my_reduction =
           *(anon_class_1_0_00000001 **)
            &(pPVar30->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0;
      body._24_8_ = plVar19[3];
      body.my_identity_element = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&body.my_reduction;
    }
    else {
      body.my_reduction =
           *(anon_class_1_0_00000001 **)
            &(pPVar30->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0;
      body.my_identity_element = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)*plVar19;
    }
    body.my_real_body = (anon_class_16_2_ed117de8_conflict33 *)plVar19[1];
    *plVar19 = (long)pPVar30;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&body);
    paVar26 = (anon_union_8_2_d71db6ad_for_task_group_context_11 *)(plVar19 + 2);
    if ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)*plVar19 == paVar26) {
      context.field_6 = *paVar26;
      context.my_context_list = (context_list *)plVar19[3];
      context.my_cpu_ctl_env = (uint64_t)&context.field_6;
    }
    else {
      context.field_6 = *paVar26;
      context.my_cpu_ctl_env = (uint64_t)*plVar19;
    }
    context._8_8_ = plVar19[1];
    *plVar19 = (long)paVar26;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    dVar11 = BVHN<4>::preBuild(this_00,(string *)&context);
    if ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)context.my_cpu_ctl_env !=
        &context.field_6) {
      operator_delete((void *)context.my_cpu_ctl_env);
    }
    if (body.my_identity_element != (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&body.my_reduction)
    {
      operator_delete(body.my_identity_element);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p);
    }
    pBVar29 = this->bvh;
    if ((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)
        ((long)(pBVar29->objects).
               super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pBVar29->objects).
               super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) < __new_size) {
      std::vector<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>::resize
                (&pBVar29->objects,(size_type)__new_size);
    }
    if ((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)
        ((long)(this->builders).
               super__Vector_base<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->builders).
               super__Vector_base<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) < __new_size) {
      std::
      vector<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
      ::resize(&this->builders,(size_type)__new_size);
    }
    resizeRefsList(this);
    LOCK();
    (this->nextRef).super___atomic_base<int>._M_i = 0;
    UNLOCK();
    context.my_version = proxy_support;
    context.my_traits = (context_traits)0x4;
    context.my_node.my_prev_node = (intrusive_list_node *)0x0;
    context.my_node.my_next_node = (intrusive_list_node *)0x0;
    context.my_name = CUSTOM_CTX;
    local_138._0_8_ = this;
    tbb::detail::r1::initialize(&context);
    body.my_real_body = (anon_class_16_2_ed117de8_conflict33 *)0x0;
    body.my_reduction = (anon_class_1_0_00000001 *)0x1;
    __str._M_dataplus._M_p = (pointer)&local_138;
    body.my_identity_element = __new_size;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&body,(anon_class_8_1_898bcfc2 *)&__str,
          (auto_partitioner *)&local_e8,&context);
    cVar18 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar18 != '\0') {
      prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar23,"task cancelled");
      __cxa_throw(prVar23,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&context);
    context.my_version = proxy_support;
    context.my_traits = (context_traits)0x4;
    context.my_node.my_prev_node = (intrusive_list_node *)0x0;
    context.my_node.my_next_node = (intrusive_list_node *)0x0;
    context.my_name = CUSTOM_CTX;
    local_138._0_8_ = this;
    tbb::detail::r1::initialize(&context);
    body.my_real_body = (anon_class_16_2_ed117de8_conflict33 *)0x0;
    body.my_reduction = (anon_class_1_0_00000001 *)0x1;
    __str._M_dataplus._M_p = (pointer)&local_138;
    body.my_identity_element = __new_size;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&body,(anon_class_8_1_898bcfc2 *)&__str,
          (auto_partitioner *)&local_e8,&context);
    cVar18 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar18 != '\0') {
      prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar23,"task cancelled");
      __cxa_throw(prVar23,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&context);
    if ((this->nextRef).super___atomic_base<int>._M_i == 1) {
      pBVar29 = this->bvh;
      pBVar7 = (this->refs).items;
      root.ptr = (pBVar7->node).ptr;
      context.my_cpu_ctl_env = *(uint64_t *)&(pBVar7->super_PrimRef).lower.field_0;
      context._8_8_ = *(undefined8 *)((long)&(pBVar7->super_PrimRef).lower.field_0 + 8);
      context.field_6 =
           *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
            &(pBVar7->super_PrimRef).upper.field_0;
      context.my_context_list = *(context_list **)((long)&(pBVar7->super_PrimRef).upper.field_0 + 8)
      ;
      bounds = &context;
      context.my_node.my_prev_node = (intrusive_list_node *)context.my_cpu_ctl_env;
      context.my_node.my_next_node = (intrusive_list_node *)context._8_8_;
      context.my_exception._M_b._M_p = (__base_type)(__base_type)context.field_6;
      context.my_itt_caller = context.my_context_list;
    }
    else {
      uVar32 = (ulong)(this->nextRef).super___atomic_base<int>._M_i;
      uVar25 = (this->refs).size_alloced;
      uVar27 = uVar25;
      if ((uVar25 < uVar32) && (uVar27 = uVar32, uVar25 != 0)) {
        while (uVar27 = uVar25, uVar27 < uVar32) {
          uVar25 = uVar27 * 2 + (ulong)(uVar27 * 2 == 0);
        }
      }
      if (uVar32 < (this->refs).size_active) {
        (this->refs).size_active = uVar32;
      }
      if ((this->refs).size_alloced == uVar27) {
        (this->refs).size_active = uVar32;
      }
      else {
        pBVar7 = (this->refs).items;
        if (uVar27 != 0) {
          pMVar8 = (this->refs).alloc.device;
          (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,uVar27 << 6,0);
        }
        sVar28 = uVar27 << 6;
        if (sVar28 < 0x1c00000) {
          pBVar21 = (BuildRef *)alignedMalloc(sVar28,0x20);
        }
        else {
          pBVar21 = (BuildRef *)os_malloc(sVar28,&(this->refs).alloc.hugepages);
        }
        (this->refs).items = pBVar21;
        if ((this->refs).size_active != 0) {
          lVar22 = 0x20;
          uVar25 = 0;
          do {
            pBVar21 = (this->refs).items;
            puVar1 = (undefined8 *)((long)pBVar7 + lVar22 + -0x20);
            uVar15 = puVar1[1];
            puVar2 = (undefined8 *)((long)pBVar21 + lVar22 + -0x20);
            *puVar2 = *puVar1;
            puVar2[1] = uVar15;
            puVar1 = (undefined8 *)((long)pBVar7 + lVar22 + -0x10);
            uVar15 = puVar1[1];
            puVar2 = (undefined8 *)((long)pBVar21 + lVar22 + -0x10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar15;
            *(undefined4 *)((long)&(pBVar21->super_PrimRef).lower.field_0 + lVar22 + 8) =
                 *(undefined4 *)((long)&(pBVar7->super_PrimRef).lower.field_0 + lVar22 + 8);
            *(undefined8 *)((long)&(pBVar21->super_PrimRef).lower.field_0 + lVar22) =
                 *(undefined8 *)((long)&(pBVar7->super_PrimRef).lower.field_0 + lVar22);
            uVar25 = uVar25 + 1;
            lVar22 = lVar22 + 0x40;
          } while (uVar25 < (this->refs).size_active);
        }
        sVar28 = (this->refs).size_alloced;
        if (pBVar7 != (BuildRef *)0x0) {
          if (sVar28 << 6 < 0x1c00000) {
            alignedFree(pBVar7);
          }
          else {
            os_free(pBVar7,sVar28 << 6,(this->refs).alloc.hugepages);
          }
        }
        if (sVar28 != 0) {
          pMVar8 = (this->refs).alloc.device;
          (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar28 * -0x40,1);
        }
        (this->refs).size_active = uVar32;
        (this->refs).size_alloced = uVar27;
      }
      sVar28 = (this->refs).size_active;
      uVar25 = sVar28 * 2;
      uVar27 = (ulong)((float)sVar33 / 1000.0);
      uVar27 = (long)((float)sVar33 / 1000.0 - 9.223372e+18) & (long)uVar27 >> 0x3f | uVar27;
      if (uVar27 < uVar25) {
        uVar27 = uVar25;
      }
      uVar25 = 1000;
      if (1000 < uVar27) {
        uVar25 = uVar27;
      }
      local_138._0_8_ =
           (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *)0x7f8000007f800000
      ;
      local_138._8_8_ = 0x7f8000007f800000;
      local_128 = 0xff800000ff800000;
      uStack_120 = 0xff800000ff800000;
      local_118 = 0x7f8000007f800000;
      uStack_110 = 0x7f8000007f800000;
      local_108 = 0xff800000ff800000;
      uStack_100 = 0xff800000ff800000;
      local_f8 = 0;
      sStack_f0 = 0;
      local_48.func = &local_d0;
      context.my_version = proxy_support;
      context.my_traits = (context_traits)0x4;
      context.my_node.my_prev_node = (intrusive_list_node *)0x0;
      context.my_node.my_next_node = (intrusive_list_node *)0x0;
      context.my_name = CUSTOM_CTX;
      local_d0.this = this;
      local_48.identity = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_138;
      local_48.reduction = &local_229;
      tbb::detail::r1::initialize(&context);
      local_e8.my_begin = 0;
      local_e8.my_grainsize = 1;
      body.my_real_body = &local_58;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
           local_138._0_8_;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
           local_138._8_8_;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
           local_128;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
           uStack_120;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           local_118;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           uStack_110;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           local_108;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           uStack_100;
      body.my_value.begin = local_f8;
      body.my_value.end = sStack_f0;
      local_e8.my_end = sVar28;
      body.my_identity_element = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_138;
      body.my_reduction = &local_229;
      local_58.reduction = &local_229;
      local_58.func = &local_48;
      tbb::detail::d1::
      start_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/bvh_builder_twolevel.cpp:146:16)>,_const_tbb::detail::d1::auto_partitioner>
      ::run(&local_e8,&body,(auto_partitioner *)&__str,&context);
      sVar16 = body.my_value.end;
      sVar28 = body.my_value.begin;
      __str._M_dataplus._M_p =
           (pointer)body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                    field_0._0_8_;
      __str._M_string_length =
           body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.
           _8_8_;
      __str.field_2._M_allocated_capacity =
           body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.
           _0_8_;
      __str.field_2._8_8_ =
           body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.
           _8_8_;
      cVar18 = tbb::detail::r1::is_group_execution_cancelled(&context);
      if (cVar18 != '\0') {
        prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar23,"task cancelled");
        __cxa_throw(prVar23,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy(&context);
      if (sVar16 == sVar28) {
        pBVar29 = this->bvh;
        bounds = &context;
        context.my_cpu_ctl_env = 0x7f8000007f800000;
        context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
             (__atomic_base<unsigned_int>)0x7f800000;
        context.my_version = gold_2021U1;
        context.my_traits = (context_traits)0x0;
        context.my_state.super___atomic_base<unsigned_char>._M_i =
             (__atomic_base<unsigned_char>)0x80;
        context.my_lifetime_state._M_i = 0x7f;
        context.field_6.my_parent = (task_group_context *)0xff800000ff800000;
        context.my_context_list = (context_list *)0xff800000ff800000;
        context.my_node.my_prev_node = (intrusive_list_node *)0x7f8000007f800000;
        context.my_node.my_next_node = (intrusive_list_node *)0x7f8000007f800000;
        context.my_exception._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
        context.my_itt_caller = (void *)0xff800000ff800000;
        root.ptr = 8;
        sVar33 = 0;
      }
      else {
        context.my_context_list = (context_list *)0x1;
        context.my_node.my_next_node = (intrusive_list_node *)&DAT_3f8000003f800000;
        context.my_itt_caller = (void *)0xffffffffffffffff;
        context.my_cpu_ctl_env = 4;
        context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
             (__atomic_base<unsigned_int>)0x28;
        context.my_version = gold_2021U1;
        context.my_traits = (context_traits)0x0;
        context.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x0
        ;
        context.my_lifetime_state._M_i = created;
        for (iVar10 = 0x1f; 4U >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
        context.field_6 = (anon_union_8_2_d71db6ad_for_task_group_context_11)(long)iVar10;
        context.my_node.my_prev_node = (intrusive_list_node *)0x1;
        context.my_exception._M_b._M_p = (__base_type)this->singleThreadThreshold;
        uVar27 = (this->refs).size_alloced;
        uVar32 = uVar27;
        if ((uVar27 < uVar25) && (uVar32 = uVar25, uVar17 = uVar27, uVar27 != 0)) {
          while (uVar32 = uVar17, uVar27 < uVar25) {
            uVar27 = uVar32 * 2;
            uVar17 = uVar27 + (uVar27 == 0);
          }
        }
        if (uVar25 < (this->refs).size_active) {
          (this->refs).size_active = uVar25;
        }
        if ((this->refs).size_alloced == uVar32) {
          (this->refs).size_active = uVar25;
        }
        else {
          pBVar7 = (this->refs).items;
          if (uVar32 != 0) {
            pMVar8 = (this->refs).alloc.device;
            (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,uVar32 << 6,0);
          }
          sVar28 = uVar32 << 6;
          if (sVar28 < 0x1c00000) {
            pBVar21 = (BuildRef *)alignedMalloc(sVar28,0x20);
          }
          else {
            pBVar21 = (BuildRef *)os_malloc(sVar28,&(this->refs).alloc.hugepages);
          }
          (this->refs).items = pBVar21;
          if ((this->refs).size_active != 0) {
            lVar22 = 0x20;
            uVar27 = 0;
            do {
              pBVar21 = (this->refs).items;
              puVar1 = (undefined8 *)((long)pBVar7 + lVar22 + -0x20);
              uVar15 = puVar1[1];
              puVar2 = (undefined8 *)((long)pBVar21 + lVar22 + -0x20);
              *puVar2 = *puVar1;
              puVar2[1] = uVar15;
              puVar3 = (undefined4 *)((long)pBVar7 + lVar22 + -0x10);
              uVar12 = puVar3[1];
              uVar13 = puVar3[2];
              uVar14 = puVar3[3];
              puVar4 = (undefined4 *)((long)pBVar21 + lVar22 + -0x10);
              *puVar4 = *puVar3;
              puVar4[1] = uVar12;
              puVar4[2] = uVar13;
              puVar4[3] = uVar14;
              *(undefined4 *)((long)&(pBVar21->super_PrimRef).lower.field_0 + lVar22 + 8) =
                   *(undefined4 *)((long)&(pBVar7->super_PrimRef).lower.field_0 + lVar22 + 8);
              *(undefined8 *)((long)&(pBVar21->super_PrimRef).lower.field_0 + lVar22) =
                   *(undefined8 *)((long)&(pBVar7->super_PrimRef).lower.field_0 + lVar22);
              uVar27 = uVar27 + 1;
              lVar22 = lVar22 + 0x40;
            } while (uVar27 < (this->refs).size_active);
          }
          sVar28 = (this->refs).size_alloced;
          if (pBVar7 != (BuildRef *)0x0) {
            if (sVar28 << 6 < 0x1c00000) {
              alignedFree(pBVar7);
            }
            else {
              os_free(pBVar7,sVar28 << 6,(this->refs).alloc.hugepages);
            }
          }
          if (sVar28 != 0) {
            pMVar8 = (this->refs).alloc.device;
            (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar28 * -0x40,1);
          }
          (this->refs).size_active = uVar25;
          (this->refs).size_alloced = uVar32;
        }
        root = BVHBuilderBinnedOpenMergeSAH::
               build<embree::NodeRefPtr<4>,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::BuildRef,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::BuildRef_const*,embree::range<unsigned_long>const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::BuildRef&,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::BuildRef*)_1_,embree::sse2::BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::build()::_lambda(unsigned_long)_1_>
                         (&this->bvh->alloc,&body,this,this,(this->refs).items,uVar25,&__str,
                          &context);
        pBVar29 = this->bvh;
        body.my_identity_element =
             (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)__str._M_dataplus._M_p;
        body.my_real_body = (anon_class_16_2_ed117de8_conflict33 *)__str._M_string_length;
        body.my_reduction = (anon_class_1_0_00000001 *)__str.field_2._M_allocated_capacity;
        body._24_8_ = __str.field_2._8_8_;
        body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
             __str._M_dataplus._M_p;
        body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
             __str._M_string_length;
        body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
             __str.field_2._M_allocated_capacity;
        body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
             __str.field_2._8_8_;
        bounds = (task_group_context *)&body;
      }
    }
    BVHN<4>::set(pBVar29,(NodeRef)root.ptr,(LBBox3fa *)bounds,sVar33);
    pBVar29 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar29->alloc);
    ppTVar9 = (pBVar29->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar31 = (pBVar29->alloc).thread_local_allocators.
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar31 != ppTVar9;
        ppTVar31 = ppTVar31 + 1) {
      FastAllocator::ThreadLocal2::unbind(*ppTVar31,&pBVar29->alloc);
    }
    ppTVar31 = (pBVar29->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar29->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar31) {
      (pBVar29->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar31;
    }
    BVHN<4>::postBuild(this->bvh,dVar11);
  }
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::build()
    {
      /* delete some objects */
      size_t num = scene->size();
      if (num < bvh->objects.size()) {
        parallel_for(num, bvh->objects.size(), [&] (const range<size_t>& r) {
            for (size_t i=r.begin(); i<r.end(); i++) {
              builders[i].reset();
              delete bvh->objects[i]; bvh->objects[i] = nullptr;
            }
          });
      }
      
#if PROFILE
      while(1) 
#endif
      {
      /* reset memory allocator */
      bvh->alloc.reset();
      
      /* skip build for empty scene */
      const size_t numPrimitives = scene->getNumPrimitives(gtype,false);

      if (numPrimitives == 0) {
        prims.resize(0);
        bvh->set(BVH::emptyNode,empty,0);
        return;
      }

      /* calculate the size of the entire BVH */
      const size_t numLeafBlocks = Primitive::blocks(numPrimitives);
      const size_t node_bytes = 2*numLeafBlocks*sizeof(typename BVH::AABBNode)/N;
      const size_t leaf_bytes = size_t(1.2*numLeafBlocks*sizeof(Primitive));
      bvh->alloc.init_estimate(node_bytes+leaf_bytes); 

      double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "BuilderTwoLevel");

      /* resize object array if scene got larger */
      if (bvh->objects.size()  < num) bvh->objects.resize(num);
      if (builders.size() < num) builders.resize(num);
      resizeRefsList ();
      nextRef.store(0);
      
      /* create acceleration structures */
      parallel_for(size_t(0), num, [&] (const range<size_t>& r)
      {
        for (size_t objectID=r.begin(); objectID<r.end(); objectID++)
        {
          Mesh* mesh = scene->getSafe<Mesh>(objectID);
      
          /* ignore meshes we do not support */
          if (mesh == nullptr || mesh->numTimeSteps != 1)
            continue;
          
          if (isSmallGeometry(mesh)) {
             setupSmallBuildRefBuilder (objectID, mesh);
          } else {
            setupLargeBuildRefBuilder (objectID, mesh);
          }
        }
      });

      /* parallel build of acceleration structures */
      parallel_for(size_t(0), num, [&] (const range<size_t>& r)
      {
        for (size_t objectID=r.begin(); objectID<r.end(); objectID++)
        {
          /* ignore if no triangle mesh or not enabled */
          Mesh* mesh = scene->getSafe<Mesh>(objectID);
          if (mesh == nullptr || !mesh->isEnabled() || mesh->numTimeSteps != 1) 
            continue;

          builders[objectID]->attachBuildRefs (this);
        }
      });


#if PROFILE
      double d0 = getSeconds();
#endif
      /* fast path for single geometry scenes */
      if (nextRef == 1) { 
        bvh->set(refs[0].node,LBBox3fa(refs[0].bounds()),numPrimitives);
      }

      else
      {     
        /* open all large nodes */
        refs.resize(nextRef);

        /* this probably needs some more tuning */
        const size_t extSize = max(max((size_t)SPLIT_MIN_EXT_SPACE,refs.size()*SPLIT_MEMORY_RESERVE_SCALE),size_t((float)numPrimitives / SPLIT_MEMORY_RESERVE_FACTOR));
 
#if !ENABLE_DIRECT_SAH_MERGE_BUILDER

#if ENABLE_OPEN_SEQUENTIAL
        open_sequential(extSize); 
#endif
        /* compute PrimRefs */
        prims.resize(refs.size());
#endif
        
        {
#if ENABLE_DIRECT_SAH_MERGE_BUILDER

          const PrimInfo pinfo = parallel_reduce(size_t(0), refs.size(),  PrimInfo(empty), [&] (const range<size_t>& r) -> PrimInfo {

              PrimInfo pinfo(empty);
              for (size_t i=r.begin(); i<r.end(); i++) {
                pinfo.add_center2(refs[i]);
              }
              return pinfo;
            }, [] (const PrimInfo& a, const PrimInfo& b) { return PrimInfo::merge(a,b); });
          
#else
          const PrimInfo pinfo = parallel_reduce(size_t(0), refs.size(),  PrimInfo(empty), [&] (const range<size_t>& r) -> PrimInfo {

              PrimInfo pinfo(empty);
              for (size_t i=r.begin(); i<r.end(); i++) {
                pinfo.add_center2(refs[i]);
                prims[i] = PrimRef(refs[i].bounds(),(size_t)refs[i].node);
              }
              return pinfo;
            }, [] (const PrimInfo& a, const PrimInfo& b) { return PrimInfo::merge(a,b); });
#endif   
       
          /* skip if all objects where empty */
          if (pinfo.size() == 0)
            bvh->set(BVH::emptyNode,empty,0);
        
          /* otherwise build toplevel hierarchy */
          else
          {
            /* settings for BVH build */
            GeneralBVHBuilder::Settings settings;
            settings.branchingFactor = N;
            settings.maxDepth = BVH::maxBuildDepthLeaf;
            settings.logBlockSize = bsr(N);
            settings.minLeafSize = 1;
            settings.maxLeafSize = 1;
            settings.travCost = 1.0f;
            settings.intCost = 1.0f;
            settings.singleThreadThreshold = singleThreadThreshold;
      
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            
            refs.resize(extSize); 
         
            NodeRef root = BVHBuilderBinnedOpenMergeSAH::build<NodeRef,BuildRef>(
              typename BVH::CreateAlloc(bvh),
              typename BVH::AABBNode::Create2(),
              typename BVH::AABBNode::Set2(),
              
              [&] (const BuildRef* refs, const range<size_t>& range, const FastAllocator::CachedAllocator& alloc) -> NodeRef  {
                assert(range.size() == 1);
                return (NodeRef) refs[range.begin()].node;
              },
              [&] (BuildRef &bref, BuildRef *refs) -> size_t { 
                return openBuildRef(bref,refs);
              },              
              [&] (size_t dn) { bvh->scene->progressMonitor(0); },
              refs.data(),extSize,pinfo,settings);
#else
            NodeRef root = BVHBuilderBinnedSAH::build<NodeRef>(
              typename BVH::CreateAlloc(bvh),
              typename BVH::AABBNode::Create2(),
              typename BVH::AABBNode::Set2(),
              
              [&] (const PrimRef* prims, const range<size_t>& range, const FastAllocator::CachedAllocator& alloc) -> NodeRef {
                assert(range.size() == 1);
                return (NodeRef) prims[range.begin()].ID();
              },
              [&] (size_t dn) { bvh->scene->progressMonitor(0); },
              prims.data(),pinfo,settings);
#endif

            
            bvh->set(root,LBBox3fa(pinfo.geomBounds),numPrimitives);
          }
        }
      }  
        
      bvh->alloc.cleanup();
      bvh->postBuild(t0);
#if PROFILE
      double d1 = getSeconds();
      std::cout << "TOP_LEVEL OPENING/REBUILD TIME " << 1000.0*(d1-d0) << " ms" << std::endl;
#endif
      }

    }
    
    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::deleteGeometry(size_t geomID)
    {
      if (geomID >= bvh->objects.size()) return;
      if (builders[geomID]) builders[geomID].reset();
      delete bvh->objects [geomID]; bvh->objects [geomID] = nullptr;
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::clear()
    {
      for (size_t i=0; i<bvh->objects.size(); i++) 
        if (bvh->objects[i]) bvh->objects[i]->clear();

      for (size_t i=0; i<builders.size(); i++) 
        if (builders[i]) builders[i].reset();

      refs.clear();
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::open_sequential(const size_t extSize)
    {
      if (refs.size() == 0)
	return;

      refs.reserve(extSize);

#if 1
      for (size_t i=0;i<refs.size();i++)
      {
        NodeRef ref = refs[i].node;
        if (ref.isAABBNode())
          BVH::prefetch(ref);
      }
#endif

      std::make_heap(refs.begin(),refs.end());
      while (refs.size()+N-1 <= extSize)
      {
        std::pop_heap (refs.begin(),refs.end()); 
        NodeRef ref = refs.back().node;
        if (ref.isLeaf()) break;
        refs.pop_back();    
        
        AABBNode* node = ref.getAABBNode();
        for (size_t i=0; i<N; i++) {
          if (node->child(i) == BVH::emptyNode) continue;
          refs.push_back(BuildRef(node->bounds(i),node->child(i)));
         
#if 1
          NodeRef ref_pre = node->child(i);
          if (ref_pre.isAABBNode())
            ref_pre.prefetch();
#endif
          std::push_heap (refs.begin(),refs.end()); 
        }
      }
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupSmallBuildRefBuilder (size_t objectID, Mesh const * const /*mesh*/)
    {
      if (builders[objectID] == nullptr ||                                         // new mesh
          dynamic_cast<RefBuilderSmall*>(builders[objectID].get()) == nullptr)     // size change resulted in large->small change
      {
        builders[objectID].reset (new RefBuilderSmall(objectID));
      }
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupLargeBuildRefBuilder (size_t objectID, Mesh const * const mesh)
    {
      if (bvh->objects[objectID] == nullptr ||                                  // new mesh
          builders[objectID]->meshQualityChanged (mesh->quality) ||             // changed build quality
          dynamic_cast<RefBuilderLarge*>(builders[objectID].get()) == nullptr)  // size change resulted in small->large change
      {
        Builder* builder = nullptr;
        delete bvh->objects[objectID]; 
        createMeshAccel(objectID, builder);
        builders[objectID].reset (new RefBuilderLarge(objectID, builder, mesh->quality));
      }
    }

#if defined(EMBREE_GEOMETRY_TRIANGLE)
    Builder* BVH4BuilderTwoLevelTriangle4MeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH4BuilderTwoLevelTriangle4vMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4v>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH4BuilderTwoLevelTriangle4iMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4i>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_QUAD)
    Builder* BVH4BuilderTwoLevelQuadMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
    return new BVHNBuilderTwoLevel<4,QuadMesh,Quad4v>((BVH4*)bvh,scene,QuadMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_USER)
    Builder* BVH4BuilderTwoLevelVirtualSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
    return new BVHNBuilderTwoLevel<4,UserGeometry,Object>((BVH4*)bvh,scene,UserGeometry::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE)
    Builder* BVH4BuilderTwoLevelInstanceSAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,Instance,InstancePrimitive>((BVH4*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE_ARRAY)
    Builder* BVH4BuilderTwoLevelInstanceArraySAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,InstanceArray,InstanceArrayPrimitive>((BVH4*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(__AVX__)
#if defined(EMBREE_GEOMETRY_TRIANGLE)
    Builder* BVH8BuilderTwoLevelTriangle4MeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH8BuilderTwoLevelTriangle4vMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4v>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH8BuilderTwoLevelTriangle4iMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4i>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_QUAD)
    Builder* BVH8BuilderTwoLevelQuadMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,QuadMesh,Quad4v>((BVH8*)bvh,scene,QuadMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_USER)
    Builder* BVH8BuilderTwoLevelVirtualSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,UserGeometry,Object>((BVH8*)bvh,scene,UserGeometry::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE)
    Builder* BVH8BuilderTwoLevelInstanceSAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,Instance,InstancePrimitive>((BVH8*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE_ARRAY)
    Builder* BVH8BuilderTwoLevelInstanceArraySAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,InstanceArray,InstanceArrayPrimitive>((BVH8*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#endif
  }